

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ecdsa_sign_inner
              (secp256k1_context *ctx,secp256k1_scalar *r,secp256k1_scalar *s,int *recid,
              uchar *msg32,uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  code *pcVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int overflow;
  secp256k1_scalar non;
  secp256k1_scalar msg;
  secp256k1_scalar sec;
  uchar nonce32 [32];
  uint local_120;
  uint local_11c [4];
  uint local_10c;
  undefined8 local_108;
  uint *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  secp256k1_scalar *local_d8;
  secp256k1_scalar *local_d0;
  uint *local_c8;
  uchar *local_c0;
  secp256k1_scalar local_b8;
  secp256k1_scalar local_98;
  secp256k1_scalar local_78;
  uchar local_58 [40];
  
  local_120 = 0;
  r->d[2] = 0;
  r->d[3] = 0;
  r->d[0] = 0;
  r->d[1] = 0;
  s->d[2] = 0;
  s->d[3] = 0;
  s->d[0] = 0;
  s->d[1] = 0;
  if (recid != (int *)0x0) {
    *recid = 0;
  }
  pcVar7 = nonce_function_rfc6979;
  if (noncefp != (secp256k1_nonce_function)0x0) {
    pcVar7 = noncefp;
  }
  local_d8 = r;
  local_d0 = s;
  local_c8 = (uint *)recid;
  local_c0 = seckey;
  secp256k1_scalar_set_b32(&local_78,seckey,(int *)&local_108);
  local_10c = (uint)(((local_78.d[2] != 0 || local_78.d[3] != 0) ||
                     (local_78.d[1] != 0 || local_78.d[0] != 0)) && (int)local_108 == 0);
  local_108 = CONCAT44(local_108._4_4_,local_10c) ^ 1;
  uVar1 = (long)(int)local_108 - 1;
  local_78.d[1] = local_78.d[1] & uVar1;
  local_78.d[0] = local_108 & 0xffffffff | local_78.d[0] & uVar1;
  local_78.d[3] = uVar1 & local_78.d[3];
  local_78.d[2] = local_78.d[2] & uVar1;
  secp256k1_scalar_set_b32(&local_98,msg32,(int *)0x0);
  uVar6 = 0;
  do {
    bVar3 = false;
    iVar4 = (*pcVar7)(local_58,msg32,local_c0,(uchar *)0x0,noncedata,uVar6);
    local_120 = (uint)(iVar4 != 0);
    if (iVar4 != 0) {
      secp256k1_scalar_set_b32(&local_b8,local_58,(int *)&local_108);
      local_11c[0] = (uint)(((local_b8.d[3] != 0 || local_b8.d[1] != 0) ||
                            (local_b8.d[2] != 0 || local_b8.d[0] != 0)) && (int)local_108 == 0);
      if (ctx->declassify != 0) {
        local_108 = 0x4d430002;
        local_100 = local_11c;
        local_f8 = 4;
        local_f0 = 0;
        local_e8 = 0;
        local_e0 = 0;
        local_11c[1] = 0;
        local_11c[2] = 0;
      }
      if (local_11c[0] != 0) {
        local_120 = secp256k1_ecdsa_sig_sign
                              (&ctx->ecmult_gen_ctx,local_d8,local_d0,&local_78,&local_98,&local_b8,
                               (int *)local_c8);
        if (ctx->declassify != 0) {
          local_108 = 0x4d430002;
          local_100 = &local_120;
          local_f8 = 4;
          local_f0 = 0;
          local_e8 = 0;
          local_e0 = 0;
          local_11c[1] = 0;
          local_11c[2] = 0;
        }
        if (local_120 != 0) {
          bVar3 = false;
          goto LAB_00115ad4;
        }
      }
      uVar6 = uVar6 + 1;
      bVar3 = true;
    }
LAB_00115ad4:
    if (!bVar3) {
      uVar6 = local_10c & local_120 ^ 1;
      lVar5 = (long)(int)uVar6 + -1;
      auVar8._8_4_ = (int)lVar5;
      auVar8._0_8_ = lVar5;
      auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar2 = *(undefined1 (*) [16])(local_d8->d + 2);
      *(undefined1 (*) [16])local_d8->d = *(undefined1 (*) [16])local_d8->d & auVar8;
      *(undefined1 (*) [16])(local_d8->d + 2) = auVar2 & auVar8;
      lVar5 = (long)(int)uVar6 + -1;
      auVar9._8_4_ = (int)lVar5;
      auVar9._0_8_ = lVar5;
      auVar9._12_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar2 = *(undefined1 (*) [16])(local_d0->d + 2);
      *(undefined1 (*) [16])local_d0->d = *(undefined1 (*) [16])local_d0->d & auVar9;
      *(undefined1 (*) [16])(local_d0->d + 2) = auVar2 & auVar9;
      if (local_c8 != (uint *)0x0) {
        *local_c8 = *local_c8 & uVar6 - 1;
      }
      return local_10c & local_120;
    }
  } while( true );
}

Assistant:

static int secp256k1_ecdsa_sign_inner(const secp256k1_context* ctx, secp256k1_scalar* r, secp256k1_scalar* s, int* recid, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar sec, non, msg;
    int ret = 0;
    int is_sec_valid;
    unsigned char nonce32[32];
    unsigned int count = 0;
    /* Default initialization here is important so we won't pass uninit values to the cmov in the end */
    *r = secp256k1_scalar_zero;
    *s = secp256k1_scalar_zero;
    if (recid) {
        *recid = 0;
    }
    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }

    /* Fail if the secret key is invalid. */
    is_sec_valid = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_one, !is_sec_valid);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    while (1) {
        int is_nonce_valid;
        ret = !!noncefp(nonce32, msg32, seckey, NULL, (void*)noncedata, count);
        if (!ret) {
            break;
        }
        is_nonce_valid = secp256k1_scalar_set_b32_seckey(&non, nonce32);
        /* The nonce is still secret here, but it being invalid is less likely than 1:2^255. */
        secp256k1_declassify(ctx, &is_nonce_valid, sizeof(is_nonce_valid));
        if (is_nonce_valid) {
            ret = secp256k1_ecdsa_sig_sign(&ctx->ecmult_gen_ctx, r, s, &sec, &msg, &non, recid);
            /* The final signature is no longer a secret, nor is the fact that we were successful or not. */
            secp256k1_declassify(ctx, &ret, sizeof(ret));
            if (ret) {
                break;
            }
        }
        count++;
    }
    /* We don't want to declassify is_sec_valid and therefore the range of
     * seckey. As a result is_sec_valid is included in ret only after ret was
     * used as a branching variable. */
    ret &= is_sec_valid;
    memset(nonce32, 0, 32);
    secp256k1_scalar_clear(&msg);
    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_cmov(r, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_cmov(s, &secp256k1_scalar_zero, !ret);
    if (recid) {
        const int zero = 0;
        secp256k1_int_cmov(recid, &zero, !ret);
    }
    return ret;
}